

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxSolverBase(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,Type p_type,Representation p_rep,TYPE ttype)

{
  double dVar1;
  cpp_dec_float<200U,_int,_void> *pcVar2;
  double *pdVar3;
  Timer *pTVar4;
  shared_ptr<soplex::Tolerances> local_e8;
  shared_ptr<soplex::Tolerances> local_d8;
  shared_ptr<soplex::Tolerances> local_c8;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxLPBase(&this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxBasisBase(&this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,USER_TIME);
  (this->
  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).
  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._vptr_ClassArray = (_func_int **)&PTR__SPxSolverBase_00545db8;
  (this->
  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).
  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._vptr_ClassArray = (_func_int **)&PTR__SPxSolverBase_00546278;
  (this->
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SPxBasisBase = (_func_int **)&PTR_change_00546298;
  this->theType = p_type;
  this->thePricing = FULL;
  this->theRep = p_rep;
  this->polishObj = POLISH_OFF;
  this->theTime = (Timer *)0x0;
  this->timerType = ttype;
  this->theCumulativeTime = 0.0;
  this->maxIters = -1;
  pdVar3 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_b0,*pdVar3,(type *)0x0);
  dVar1 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double(&local_b0)
  ;
  this->maxTime = dVar1;
  this->nClckSkipsLeft = 0;
  this->nCallsToTimelim = 0;
  pdVar3 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(this->objLimit).m_backend,*pdVar3,(type *)0x0);
  this->useTerminationValue = true;
  this->m_status = UNKNOWN;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(this->m_nonbasicValue).m_backend,0.0,(type *)0x0);
  this->m_nonbasicValueUpToDate = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(this->m_pricingViol).m_backend,0.0,(type *)0x0);
  this->m_pricingViolUpToDate = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(this->m_pricingViolCo).m_backend,0.0,(type *)0x0);
  this->m_pricingViolCoUpToDate = false;
  this->m_numViol = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(this->entertolscale).m_backend,1.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(this->leavetolscale).m_backend,1.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&(this->theShift).m_backend,0,(type *)0x0);
  pcVar2 = &(this->lastShift).m_backend;
  (pcVar2->data)._M_elems[0x18] = 0;
  (pcVar2->data)._M_elems[0x19] = 0;
  pcVar2 = &(this->lastShift).m_backend;
  (pcVar2->data)._M_elems[0x1a] = 0;
  (pcVar2->data)._M_elems[0x1b] = 0;
  pcVar2 = &(this->lastShift).m_backend;
  (pcVar2->data)._M_elems[0x14] = 0;
  (pcVar2->data)._M_elems[0x15] = 0;
  pcVar2 = &(this->lastShift).m_backend;
  (pcVar2->data)._M_elems[0x16] = 0;
  (pcVar2->data)._M_elems[0x17] = 0;
  pcVar2 = &(this->lastShift).m_backend;
  (pcVar2->data)._M_elems[0x10] = 0;
  (pcVar2->data)._M_elems[0x11] = 0;
  pcVar2 = &(this->lastShift).m_backend;
  (pcVar2->data)._M_elems[0x12] = 0;
  (pcVar2->data)._M_elems[0x13] = 0;
  pcVar2 = &(this->lastShift).m_backend;
  (pcVar2->data)._M_elems[0xc] = 0;
  (pcVar2->data)._M_elems[0xd] = 0;
  pcVar2 = &(this->lastShift).m_backend;
  (pcVar2->data)._M_elems[0xe] = 0;
  (pcVar2->data)._M_elems[0xf] = 0;
  pcVar2 = &(this->lastShift).m_backend;
  (pcVar2->data)._M_elems[8] = 0;
  (pcVar2->data)._M_elems[9] = 0;
  pcVar2 = &(this->lastShift).m_backend;
  (pcVar2->data)._M_elems[10] = 0;
  (pcVar2->data)._M_elems[0xb] = 0;
  pcVar2 = &(this->lastShift).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(this->lastShift).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->lastShift).m_backend.data._M_elems + 0x6d) = 0;
  (this->lastShift).m_backend.data._M_elems[0] = 0;
  (this->lastShift).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(this->lastShift).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  (this->lastShift).m_backend.fpclass = cpp_dec_float_finite;
  (this->lastShift).m_backend.prec_elem = 0x1c;
  this->m_maxCycle = 100;
  this->m_numCycle = 0;
  this->initialized = false;
  this->solveVector2 =
       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->solveVector3 =
       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->coSolveVector2 =
       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->coSolveVector3 =
       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->freePricer = false;
  this->freeRatioTester = false;
  this->freeStarter = false;
  (this->instableLeaveVal).m_backend.data._M_elems[0] = 0;
  (this->instableLeaveVal).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(this->instableLeaveVal).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(this->instableLeaveVal).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(this->instableLeaveVal).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  pcVar2 = &(this->instableLeaveVal).m_backend;
  (pcVar2->data)._M_elems[8] = 0;
  (pcVar2->data)._M_elems[9] = 0;
  pcVar2 = &(this->instableLeaveVal).m_backend;
  (pcVar2->data)._M_elems[10] = 0;
  (pcVar2->data)._M_elems[0xb] = 0;
  pcVar2 = &(this->instableLeaveVal).m_backend;
  (pcVar2->data)._M_elems[0xc] = 0;
  (pcVar2->data)._M_elems[0xd] = 0;
  pcVar2 = &(this->instableLeaveVal).m_backend;
  (pcVar2->data)._M_elems[0xe] = 0;
  (pcVar2->data)._M_elems[0xf] = 0;
  pcVar2 = &(this->instableLeaveVal).m_backend;
  (pcVar2->data)._M_elems[0x10] = 0;
  (pcVar2->data)._M_elems[0x11] = 0;
  pcVar2 = &(this->instableLeaveVal).m_backend;
  (pcVar2->data)._M_elems[0x12] = 0;
  (pcVar2->data)._M_elems[0x13] = 0;
  pcVar2 = &(this->instableLeaveVal).m_backend;
  (pcVar2->data)._M_elems[0x14] = 0;
  (pcVar2->data)._M_elems[0x15] = 0;
  pcVar2 = &(this->instableLeaveVal).m_backend;
  (pcVar2->data)._M_elems[0x16] = 0;
  (pcVar2->data)._M_elems[0x17] = 0;
  pcVar2 = &(this->instableLeaveVal).m_backend;
  (pcVar2->data)._M_elems[0x18] = 0;
  (pcVar2->data)._M_elems[0x19] = 0;
  pcVar2 = &(this->instableLeaveVal).m_backend;
  (pcVar2->data)._M_elems[0x1a] = 0;
  (pcVar2->data)._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(this->instableLeaveVal).m_backend.data._M_elems + 0x6d) = 0;
  (this->instableLeaveVal).m_backend.fpclass = cpp_dec_float_finite;
  (this->instableLeaveVal).m_backend.prec_elem = 0x1c;
  (this->instableEnterId).super_DataKey = (DataKey)0xffffffff00000000;
  (this->instableEnterVal).m_backend.fpclass = cpp_dec_float_finite;
  (this->instableEnterVal).m_backend.prec_elem = 0x1c;
  (this->instableEnterVal).m_backend.data._M_elems[0] = 0;
  (this->instableEnterVal).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(this->instableEnterVal).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(this->instableEnterVal).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(this->instableEnterVal).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  pcVar2 = &(this->instableEnterVal).m_backend;
  (pcVar2->data)._M_elems[8] = 0;
  (pcVar2->data)._M_elems[9] = 0;
  pcVar2 = &(this->instableEnterVal).m_backend;
  (pcVar2->data)._M_elems[10] = 0;
  (pcVar2->data)._M_elems[0xb] = 0;
  pcVar2 = &(this->instableEnterVal).m_backend;
  (pcVar2->data)._M_elems[0xc] = 0;
  (pcVar2->data)._M_elems[0xd] = 0;
  pcVar2 = &(this->instableEnterVal).m_backend;
  (pcVar2->data)._M_elems[0xe] = 0;
  (pcVar2->data)._M_elems[0xf] = 0;
  pcVar2 = &(this->instableEnterVal).m_backend;
  (pcVar2->data)._M_elems[0x10] = 0;
  (pcVar2->data)._M_elems[0x11] = 0;
  pcVar2 = &(this->instableEnterVal).m_backend;
  (pcVar2->data)._M_elems[0x12] = 0;
  (pcVar2->data)._M_elems[0x13] = 0;
  pcVar2 = &(this->instableEnterVal).m_backend;
  (pcVar2->data)._M_elems[0x18] = 0;
  (pcVar2->data)._M_elems[0x19] = 0;
  pcVar2 = &(this->instableEnterVal).m_backend;
  (pcVar2->data)._M_elems[0x1a] = 0;
  (pcVar2->data)._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(this->instableEnterVal).m_backend.data._M_elems + 0x6d) = 0;
  pcVar2 = &(this->instableEnterVal).m_backend;
  (pcVar2->data)._M_elems[0x14] = 0;
  (pcVar2->data)._M_elems[0x15] = 0;
  pcVar2 = &(this->instableEnterVal).m_backend;
  (pcVar2->data)._M_elems[0x16] = 0;
  (pcVar2->data)._M_elems[0x17] = 0;
  this->displayLine = 0;
  this->displayFreq = 200;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(this->sparsePricingFactor).m_backend,0.6,(type *)0x0);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray(&this->oldBasisStatusRows,0,0,1.2);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray(&this->oldBasisStatusCols,0,0,1.2);
  this->fullPerturbation = false;
  this->printBasisMetric = 0;
  Array<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array(&this->unitVecs,0);
  (this->primRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->primRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->primRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::UpdateVector(&this->primVec,0,&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->dualRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dualRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dualRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::UpdateVector(&this->dualVec,0,&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::UpdateVector(&this->addVec,0,&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  memset(&this->theURbound,0,0x90);
  (this->theCoTest).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->theCoTest).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->theCoTest).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->theTest).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->theTest).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->theTest).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase(&this->primalRay,8);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase(&this->dualFarkas,8);
  (this->primalDegenSum).m_backend.fpclass = cpp_dec_float_finite;
  (this->primalDegenSum).m_backend.prec_elem = 0x1c;
  (this->primalDegenSum).m_backend.data._M_elems[0] = 0;
  (this->primalDegenSum).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(this->primalDegenSum).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(this->primalDegenSum).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(this->primalDegenSum).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  pcVar2 = &(this->primalDegenSum).m_backend;
  (pcVar2->data)._M_elems[8] = 0;
  (pcVar2->data)._M_elems[9] = 0;
  pcVar2 = &(this->primalDegenSum).m_backend;
  (pcVar2->data)._M_elems[10] = 0;
  (pcVar2->data)._M_elems[0xb] = 0;
  pcVar2 = &(this->primalDegenSum).m_backend;
  (pcVar2->data)._M_elems[0xc] = 0;
  (pcVar2->data)._M_elems[0xd] = 0;
  pcVar2 = &(this->primalDegenSum).m_backend;
  (pcVar2->data)._M_elems[0xe] = 0;
  (pcVar2->data)._M_elems[0xf] = 0;
  pcVar2 = &(this->primalDegenSum).m_backend;
  (pcVar2->data)._M_elems[0x10] = 0;
  (pcVar2->data)._M_elems[0x11] = 0;
  pcVar2 = &(this->primalDegenSum).m_backend;
  (pcVar2->data)._M_elems[0x12] = 0;
  (pcVar2->data)._M_elems[0x13] = 0;
  pcVar2 = &(this->primalDegenSum).m_backend;
  (pcVar2->data)._M_elems[0x18] = 0;
  (pcVar2->data)._M_elems[0x19] = 0;
  pcVar2 = &(this->primalDegenSum).m_backend;
  (pcVar2->data)._M_elems[0x1a] = 0;
  (pcVar2->data)._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(this->primalDegenSum).m_backend.data._M_elems + 0x6d) = 0;
  pcVar2 = &(this->primalDegenSum).m_backend;
  (pcVar2->data)._M_elems[0x14] = 0;
  (pcVar2->data)._M_elems[0x15] = 0;
  pcVar2 = &(this->primalDegenSum).m_backend;
  (pcVar2->data)._M_elems[0x16] = 0;
  (pcVar2->data)._M_elems[0x17] = 0;
  (this->dualDegenSum).m_backend.fpclass = cpp_dec_float_finite;
  (this->dualDegenSum).m_backend.data._M_elems[0] = 0;
  (this->dualDegenSum).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(this->dualDegenSum).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(this->dualDegenSum).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(this->dualDegenSum).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  pcVar2 = &(this->dualDegenSum).m_backend;
  (pcVar2->data)._M_elems[8] = 0;
  (pcVar2->data)._M_elems[9] = 0;
  pcVar2 = &(this->dualDegenSum).m_backend;
  (pcVar2->data)._M_elems[10] = 0;
  (pcVar2->data)._M_elems[0xb] = 0;
  pcVar2 = &(this->dualDegenSum).m_backend;
  (pcVar2->data)._M_elems[0xc] = 0;
  (pcVar2->data)._M_elems[0xd] = 0;
  pcVar2 = &(this->dualDegenSum).m_backend;
  (pcVar2->data)._M_elems[0xe] = 0;
  (pcVar2->data)._M_elems[0xf] = 0;
  pcVar2 = &(this->dualDegenSum).m_backend;
  (pcVar2->data)._M_elems[0x18] = 0;
  (pcVar2->data)._M_elems[0x19] = 0;
  pcVar2 = &(this->dualDegenSum).m_backend;
  (pcVar2->data)._M_elems[0x1a] = 0;
  (pcVar2->data)._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(this->dualDegenSum).m_backend.data._M_elems + 0x6d) = 0;
  pcVar2 = &(this->dualDegenSum).m_backend;
  (pcVar2->data)._M_elems[0x10] = 0;
  (pcVar2->data)._M_elems[0x11] = 0;
  pcVar2 = &(this->dualDegenSum).m_backend;
  (pcVar2->data)._M_elems[0x12] = 0;
  (pcVar2->data)._M_elems[0x13] = 0;
  pcVar2 = &(this->dualDegenSum).m_backend;
  (pcVar2->data)._M_elems[0x14] = 0;
  (pcVar2->data)._M_elems[0x15] = 0;
  pcVar2 = &(this->dualDegenSum).m_backend;
  (pcVar2->data)._M_elems[0x16] = 0;
  (pcVar2->data)._M_elems[0x17] = 0;
  (this->dualDegenSum).m_backend.prec_elem = 0x1c;
  this->thepricer =
       (SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->theratiotester =
       (SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->thestarter =
       (SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(this->boundrange).m_backend,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(this->siderange).m_backend,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&(this->objrange).m_backend,0.0,(type *)0x0);
  Random::setSeed(&this->random,0);
  DIdxSet::DIdxSet(&this->infeasibilities,0);
  DIdxSet::DIdxSet(&this->infeasibilitiesCo,0);
  DIdxSet::DIdxSet(&this->updateViols,8);
  DIdxSet::DIdxSet(&this->updateViolsCo,8);
  DataArray<int>::DataArray(&this->isInfeasible,0,0,1.2);
  DataArray<int>::DataArray(&this->isInfeasibleCo,0,0,1.2);
  this->sparsePricingLeave = false;
  this->sparsePricingEnter = false;
  this->sparsePricingEnterCo = false;
  this->hyperPricingLeave = true;
  this->hyperPricingEnter = true;
  this->remainingRoundsLeave = 0;
  this->remainingRoundsEnter = 0;
  this->remainingRoundsEnterCo = 0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&this->weights,0);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&this->coWeights,0);
  this->weightsAreSetup = false;
  this->multSparseCalls = 0;
  this->multFullCalls = 0;
  this->multColwiseCalls = 0;
  this->multUnsetupCalls = 0;
  DataArray<int>::DataArray(&this->integerVariables,0,0,1.2);
  pTVar4 = TimerFactory::createTimer(this->timerType);
  this->theTime = pTVar4;
  pTVar4 = TimerFactory::createTimer(this->timerType);
  this->multTimeSparse = pTVar4;
  pTVar4 = TimerFactory::createTimer(this->timerType);
  this->multTimeFull = pTVar4;
  pTVar4 = TimerFactory::createTimer(this->timerType);
  this->multTimeColwise = pTVar4;
  pTVar4 = TimerFactory::createTimer(this->timerType);
  this->multTimeUnsetup = pTVar4;
  (this->
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).theLP = this;
  initRep(this,p_rep);
  return;
}

Assistant:

SPxSolverBase<R>::SPxSolverBase(
      Type            p_type,
      Representation  p_rep,
      Timer::TYPE     ttype)
      : theType(p_type)
      , thePricing(FULL)
      , theRep(p_rep)
      , polishObj(POLISH_OFF)
      , theTime(nullptr)
      , timerType(ttype)
      , theCumulativeTime(0.0)
      , maxIters(-1)
      , maxTime(R(infinity))
      , nClckSkipsLeft(0)
      , nCallsToTimelim(0)
      , objLimit(R(infinity))
      , useTerminationValue(true)
      , m_status(UNKNOWN)
      , m_nonbasicValue(0.0)
      , m_nonbasicValueUpToDate(false)
      , m_pricingViol(0.0)
      , m_pricingViolUpToDate(false)
      , m_pricingViolCo(0.0)
      , m_pricingViolCoUpToDate(false)
      , m_numViol(0)
      , entertolscale(1.0)
      , leavetolscale(1.0)
      , theShift(0)
      , m_maxCycle(100)
      , m_numCycle(0)
      , initialized(false)
      , solveVector2(nullptr)
      , solveVector3(nullptr)
      , coSolveVector2(nullptr)
      , coSolveVector3(nullptr)
      , freePricer(false)
      , freeRatioTester(false)
      , freeStarter(false)
      , displayLine(0)
      , displayFreq(200)
      , sparsePricingFactor(SOPLEX_SPARSITYFACTOR)
      , fullPerturbation(false)
      , printBasisMetric(0)
      , unitVecs(0)
      , primVec(0)
      , dualVec(0)
      , addVec(0)
      , thepricer(nullptr)
      , theratiotester(nullptr)
      , thestarter(nullptr)
      , boundrange(0.0)
      , siderange(0.0)
      , objrange(0.0)
      , infeasibilities(0)
      , infeasibilitiesCo(0)
      , isInfeasible(0)
      , isInfeasibleCo(0)
      , sparsePricingLeave(false)
      , sparsePricingEnter(false)
      , sparsePricingEnterCo(false)
      , hyperPricingLeave(true)
      , hyperPricingEnter(true)
      , remainingRoundsLeave(0)
      , remainingRoundsEnter(0)
      , remainingRoundsEnterCo(0)
      , weights(0)
      , coWeights(0)
      , weightsAreSetup(false)
      , multSparseCalls(0)
      , multFullCalls(0)
      , multColwiseCalls(0)
      , multUnsetupCalls(0)
      , integerVariables(0)
   {
      theTime = TimerFactory::createTimer(timerType);

      multTimeSparse = TimerFactory::createTimer(timerType);
      multTimeFull = TimerFactory::createTimer(timerType);
      multTimeColwise = TimerFactory::createTimer(timerType);
      multTimeUnsetup = TimerFactory::createTimer(timerType);

      this->theLP = this;
      initRep(p_rep);

      // info: SPxBasisBase is not consistent in this moment.
      //assert(SPxSolverBase<R>::isConsistent());
   }